

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void AddWindowToRenderList(ImVector<ImDrawList_*> *out_render_list,ImGuiWindow *window)

{
  ImGuiWindow *window_00;
  value_type *ppIVar1;
  ImVector<ImGuiWindow_*> *this;
  int i;
  int i_00;
  
  AddDrawListToRenderList(out_render_list,window->DrawList);
  this = &(window->DC).ChildWindows;
  for (i_00 = 0; i_00 < this->Size; i_00 = i_00 + 1) {
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i_00);
    window_00 = *ppIVar1;
    if ((window_00->Active == true) &&
       (((window_00->Flags & 0x2000000) == 0 || (window_00->HiddenFrames < 1)))) {
      AddWindowToRenderList(out_render_list,window_00);
    }
  }
  return;
}

Assistant:

static void AddWindowToRenderList(ImVector<ImDrawList*>& out_render_list, ImGuiWindow* window)
{
    AddDrawListToRenderList(out_render_list, window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (!child->Active) // clipped children may have been marked not active
            continue;
        if ((child->Flags & ImGuiWindowFlags_Popup) && child->HiddenFrames > 0)
            continue;
        AddWindowToRenderList(out_render_list, child);
    }
}